

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memheap.cpp
# Opt level: O2

void * __thiscall CHeap::AllocateFromChunk(CHeap *this,uint Size)

{
  CChunk *pCVar1;
  char *pcVar2;
  char *pcVar3;
  
  pCVar1 = this->m_pCurrent;
  pcVar2 = pCVar1->m_pCurrent;
  pcVar3 = pcVar2 + Size;
  if (pCVar1->m_pEnd < pcVar3) {
    return (void *)0x0;
  }
  pCVar1->m_pCurrent = pcVar3;
  return pcVar2;
}

Assistant:

void *CHeap::AllocateFromChunk(unsigned int Size)
{
	// check if we need can fit the allocation
	if(m_pCurrent->m_pCurrent + Size > m_pCurrent->m_pEnd)
		return (void*)0x0;

	// get memory and move the pointer forward
	char *pMem = m_pCurrent->m_pCurrent;
	m_pCurrent->m_pCurrent += Size;
	return pMem;
}